

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  char *pcVar4;
  BBox1f BVar5;
  size_t end;
  MemoryMonitorInterface *pMVar6;
  Split *pSVar7;
  vint *pvVar8;
  code *pcVar9;
  ThreadLocal2 *pTVar10;
  iterator iVar11;
  BBox1f *pBVar12;
  PrimRefMB *pPVar13;
  Scene *pSVar14;
  Geometry *pGVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  undefined8 uVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  bool bVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  bool bVar25;
  vint *pvVar26;
  undefined4 uVar27;
  char cVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  BBox1f BVar32;
  void *pvVar33;
  ulong uVar34;
  float *pfVar35;
  size_t sVar36;
  undefined8 *puVar37;
  runtime_error *prVar38;
  ulong *puVar39;
  PrimRefMB *pPVar40;
  char *pcVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  long *plVar48;
  long lVar49;
  long lVar50;
  BBox1f *pBVar51;
  long lVar52;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *this_00;
  BuildRecord *in_00;
  ulong uVar53;
  mvector<PrimRefMB> *prims;
  long lVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar61;
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar60 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar71 [16];
  float fVar73;
  undefined1 auVar72 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar80;
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  task_group_context *in_stack_ffffffffffffe168;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e78 [16];
  undefined1 local_1e68 [16];
  undefined1 local_1e38 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1df8 [16];
  PrimRefVector lprims;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1dd8 [2];
  PrimInfoMB left;
  PrimInfoMB right;
  vuint<4> v2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c58;
  BBox1f local_1c48;
  char acStack_1c40 [8];
  char local_1c38 [8];
  ulong uStack_1c30;
  size_t local_1c28;
  size_t sStack_1c20;
  size_t local_1c18;
  size_t sStack_1c10;
  BBox1f local_1c08;
  BBox1f BStack_1c00;
  BBox1f local_1bf8;
  undefined8 local_1be8;
  size_t sStack_1be0;
  size_t local_1bd8;
  size_t local_1bc8;
  size_t sStack_1bc0;
  size_t local_1bb8;
  size_t sStack_1bb0;
  anon_class_1_0_00000001 reduction;
  undefined1 local_1b88 [16];
  undefined1 local_1b78 [16];
  undefined1 local_1b68 [32];
  vuint<4> geomID;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b38;
  size_t local_1b28;
  BBox1f BStack_1b20;
  BBox1f local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ae8;
  size_t local_1ad8;
  size_t sStack_1ad0;
  size_t local_1ac8;
  size_t sStack_1ac0;
  BBox1f local_1ab8;
  BBox1f BStack_1ab0;
  BBox1f local_1aa8;
  undefined8 local_1a98;
  size_t sStack_1a90;
  size_t local_1a88;
  size_t local_1a78;
  size_t sStack_1a70;
  size_t local_1a68;
  size_t sStack_1a60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1a58;
  float fStack_1a50;
  float fStack_1a4c;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19e8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  size_t local_18b8 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1898;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1878;
  undefined8 local_1868;
  undefined8 uStack_1860;
  ulong local_1858;
  ulong uStack_1850;
  size_t local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  BBox1f BStack_1830;
  BBox1f local_1828;
  longlong local_1818;
  undefined8 uStack_1810;
  size_t local_1808;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined1 local_17d8 [16];
  vuint<4> v0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17b8;
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  ulong local_1758 [2];
  size_t local_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  BBox1f local_1728 [2];
  undefined1 local_1718 [16];
  size_t local_1708 [4];
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar34 = in->depth;
  if ((this->cfg).maxDepth < uVar34) {
    puVar37 = (undefined8 *)__cxa_allocate_exception(0x30);
    v0.field_0.v[0] = (longlong)&local_17b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&v0,"depth limit reached","");
    *puVar37 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar37 + 1) = 1;
    puVar37[2] = puVar37 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar37 + 2),v0.field_0.v[0],v0.field_0.v[1] + v0.field_0.v[0]);
    __cxa_throw(puVar37,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  sVar36 = *(size_t *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.lower.field_0;
  uVar19 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.lower.field_0 + 8);
  aVar20 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0;
  aVar21 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0;
  aVar22 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0;
  aVar24 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0;
  auVar58 = *(undefined1 (*) [16])
             (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             upper.field_0.m128;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  BVar5 = (BBox1f)(in->prims).prims;
  uVar53 = (in->prims).super_PrimInfoMB.object_range._begin;
  uVar42 = (in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&v0,this,&in->prims);
  local_1dd8[0]._0_8_ = auVar58._0_8_;
  local_1dd8[0]._8_8_ = auVar58._8_8_;
  local_1868 = local_1dd8[0]._0_8_;
  uStack_1860 = local_1dd8[0]._8_8_;
  local_1848 = values[0].ref.ptr;
  uStack_1840 = values[0]._8_8_;
  local_1838 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1830.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1830.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar32 = BStack_1830;
  local_1818 = v0.field_0.v[0];
  uStack_1810 = v0.field_0.v[1];
  local_1808 = local_17b8._0_8_;
  local_17f8 = local_17a8._0_8_;
  uStack_17f0 = local_17a8._8_8_;
  local_17e8 = local_1798._0_8_;
  uStack_17e0 = local_1798._8_8_;
  if ((uVar34 == 1) && (uVar42 != uVar53)) {
    BStack_1830.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1830.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar30 = uVar42 - uVar53;
    if (uVar42 < uVar53 || lVar30 == 0) {
      fVar82 = INFINITY;
      fVar87 = -INFINITY;
    }
    else {
      pfVar35 = &(*(PrimRefMB **)((long)BVar5 + 0x20))[uVar53].time_range.upper;
      fVar82 = INFINITY;
      fVar86 = -INFINITY;
      do {
        if (((BBox1f *)(pfVar35 + -1))->lower <= fVar82) {
          fVar82 = ((BBox1f *)(pfVar35 + -1))->lower;
        }
        fVar87 = *pfVar35;
        if (*pfVar35 <= fVar86) {
          fVar87 = fVar86;
        }
        pfVar35 = pfVar35 + 0x14;
        lVar30 = lVar30 + -1;
        fVar86 = fVar87;
      } while (lVar30 != 0);
    }
    bVar23 = BStack_1830.lower < fVar82 || fVar87 < BStack_1830.upper;
  }
  else {
    bVar23 = false;
  }
  local_18b8[0] = sVar36;
  local_18b8[1] = uVar19;
  local_18a8 = aVar20;
  local_1898 = aVar21;
  local_1888 = aVar22;
  local_1878 = aVar24;
  local_1858 = uVar53;
  uStack_1850 = uVar42;
  BStack_1830 = BVar32;
  local_1828 = BVar5;
  if (((uVar42 - uVar53 <= (this->cfg).maxLeafSize) &&
      (uStack_1810._4_4_ = (uint)((ulong)v0.field_0._8_8_ >> 0x20), uStack_1810._4_4_ < 2)) &&
     (!bVar23)) {
    uVar42 = (uVar42 - uVar53) + 3;
    uVar34 = uVar42 >> 2;
    geomID.field_0.v[0] = uVar34 * 0x50;
    pTVar10 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar10->alloc0).bytesUsed = 0;
      (pTVar10->alloc0).bytesWasted = 0;
      (pTVar10->alloc0).end = 0;
      (pTVar10->alloc0).allocBlockSize = 0;
      (pTVar10->alloc0).ptr = (char *)0x0;
      (pTVar10->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      v0.field_0.v[1]._0_1_ = 1;
      v2.field_0.v[0] = (longlong)pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&v2);
      }
      else {
        *iVar11._M_current = (ThreadLocal2 *)v2.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (v0.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v0.field_0.v[0]);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + geomID.field_0.v[0];
    sVar36 = (alloc.talloc1)->cur;
    uVar44 = (ulong)(-(int)sVar36 & 0xf);
    uVar46 = sVar36 + geomID.field_0.v[0] + uVar44;
    (alloc.talloc1)->cur = uVar46;
    if ((alloc.talloc1)->end < uVar46) {
      (alloc.talloc1)->cur = sVar36;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(geomID.field_0.v[0] << 2)) {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
      }
      else {
        v0.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc1)->ptr = pcVar41;
        sVar36 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar36;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = v0.field_0.v[0];
        (alloc.talloc1)->cur = geomID.field_0.v[0];
        if ((ulong)v0.field_0.v[0] < (ulong)geomID.field_0.v[0]) {
          (alloc.talloc1)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc1)->ptr = pcVar41;
          sVar36 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar36;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = v0.field_0.v[0];
          (alloc.talloc1)->cur = geomID.field_0.v[0];
          if ((ulong)v0.field_0.v[0] < (ulong)geomID.field_0.v[0]) {
            (alloc.talloc1)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_00d26b46;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar36;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar44;
      pcVar41 = (alloc.talloc1)->ptr + (uVar46 - geomID.field_0._0_8_);
    }
LAB_00d26b46:
    uVar44 = 7;
    if (uVar34 < 7) {
      uVar44 = uVar34;
    }
    local_17d8 = _DAT_01feb9f0;
    if (uVar42 < 4) {
      local_1b78._8_8_ = 0xff800000ff800000;
      local_1b78._0_8_ = 0xff800000ff800000;
      local_1b88._8_8_ = 0xff800000ff800000;
      local_1b88._0_8_ = 0xff800000ff800000;
      local_1b68._0_16_ = _DAT_01feb9f0;
    }
    else {
      lVar30 = 0;
      local_1b88._8_8_ = 0xff800000ff800000;
      local_1b88._0_8_ = 0xff800000ff800000;
      local_1b68._0_16_ = _DAT_01feb9f0;
      local_1b78._8_8_ = 0xff800000ff800000;
      local_1b78._0_8_ = 0xff800000ff800000;
      do {
        BVar5 = BStack_1830;
        pPVar13 = *(PrimRefMB **)((long)local_1828 + 0x20);
        pSVar14 = ((this->createLeaf).bvh)->scene;
        v0.field_0.v[0] = 0;
        v0.field_0.v[1] = 0;
        values[0].ref.ptr = 0;
        values[0]._8_8_ = 0;
        v2.field_0.v[0] = 0;
        v2.field_0.v[1] = 0;
        geomID.field_0.v[0] = -1;
        geomID.field_0.v[1] = -1;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             0xffffffffffffffff;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
             0xffffffffffffffff;
        pPVar40 = pPVar13 + uVar53;
        lVar31 = 0;
        do {
          if (uVar53 < uStack_1850) {
            fVar87 = (pPVar40->lbounds).bounds0.lower.field_0.m128[3];
            *(float *)((long)&geomID.field_0 + lVar31) = fVar87;
            fVar82 = (pPVar40->lbounds).bounds0.upper.field_0.m128[3];
            *(float *)((long)&left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                              .lower.field_0 + lVar31) = fVar82;
            pGVar15 = (pSVar14->geometries).items[(uint)fVar87].ptr;
            lVar54 = *(long *)&pGVar15->field_0x58;
            lVar47 = (ulong)(uint)fVar82 *
                     pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
            uVar43 = *(uint *)&pGVar15[1].intersectionFilterN >> 2;
            *(uint *)((long)&v0.field_0 + lVar31) = *(int *)(lVar54 + lVar47) * uVar43;
            *(uint *)((long)&values[0].ref.ptr + lVar31) = *(int *)(lVar54 + 4 + lVar47) * uVar43;
            *(uint *)((long)&v2.field_0 + lVar31) = uVar43 * *(int *)(lVar54 + 8 + lVar47);
            uVar53 = uVar53 + 1;
          }
          else if (lVar31 != 0) {
            *(uint *)((long)&geomID.field_0 + lVar31) = geomID.field_0.i[0];
            *(undefined4 *)
             ((long)&left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0 + lVar31) = 0xffffffff;
            uVar27 = v0.field_0.i[0];
            *(uint *)((long)&v0.field_0 + lVar31) = v0.field_0.i[0];
            *(undefined4 *)((long)&values[0].ref.ptr + lVar31) = uVar27;
            *(undefined4 *)((long)&v2.field_0 + lVar31) = uVar27;
          }
          if (uVar53 < uStack_1850) {
            pPVar40 = pPVar13 + uVar53;
          }
          lVar31 = lVar31 + 4;
        } while (lVar31 != 0x10);
        lVar31 = lVar30 * 0x50;
        *(longlong *)(pcVar41 + lVar31) = v0.field_0.v[0];
        *(longlong *)((long)(pcVar41 + lVar31) + 8) = v0.field_0.v[1];
        *(size_t *)(pcVar41 + lVar31 + 0x10) = values[0].ref.ptr;
        *(undefined8 *)((long)(pcVar41 + lVar31 + 0x10) + 8) = values[0]._8_8_;
        *(longlong *)(pcVar41 + lVar31 + 0x20) = v2.field_0.v[0];
        *(longlong *)((long)(pcVar41 + lVar31 + 0x20) + 8) = v2.field_0.v[1];
        *(longlong *)(pcVar41 + lVar31 + 0x30) = geomID.field_0.v[0];
        *(longlong *)((long)(pcVar41 + lVar31 + 0x30) + 8) = geomID.field_0.v[1];
        *(undefined8 *)(pcVar41 + lVar31 + 0x40) =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        *(undefined8 *)(pcVar41 + lVar31 + 0x40 + 8) =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b68._20_4_ = BStack_1830.upper;
        local_1a58 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                     CONCAT44(local_1b68._20_4_,local_1b68._20_4_);
        fStack_1a50 = (float)local_1b68._20_4_;
        fStack_1a4c = (float)local_1b68._20_4_;
        lVar54 = 0;
        auVar58 = _DAT_01feb9f0;
        auVar60 = _DAT_01feba00;
        auVar79 = _DAT_01feba00;
        auVar81 = _DAT_01feb9f0;
        do {
          uVar43 = *(uint *)(pcVar41 + lVar54 * 4 + lVar31 + 0x40);
          if ((ulong)uVar43 == 0xffffffff) break;
          pGVar15 = (pSVar14->geometries).items[*(uint *)(pcVar41 + lVar54 * 4 + lVar31 + 0x30)].ptr
          ;
          fVar87 = pGVar15->fnumTimeSegments;
          fVar82 = (pGVar15->time_range).lower;
          local_1b68._16_4_ = BVar5.lower;
          fVar91 = (pGVar15->time_range).upper - fVar82;
          fVar89 = ((float)local_1b68._16_4_ - fVar82) / fVar91;
          fVar91 = (local_1a58._0_4_ - fVar82) / fVar91;
          fVar90 = fVar87 * fVar91;
          fVar82 = floorf(fVar87 * fVar89);
          fVar86 = ceilf(fVar90);
          iVar29 = (int)fVar82;
          if (fVar82 <= 0.0) {
            fVar82 = 0.0;
          }
          fVar61 = fVar86;
          if (fVar87 <= fVar86) {
            fVar61 = fVar87;
          }
          if (iVar29 < 0) {
            iVar29 = -1;
          }
          uVar18 = (int)fVar87 + 1U;
          if ((int)fVar86 < (int)((int)fVar87 + 1U)) {
            uVar18 = (int)fVar86;
          }
          lVar47 = *(long *)&pGVar15->field_0x58;
          lVar52 = (ulong)uVar43 *
                   pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar42 = (ulong)*(uint *)(lVar47 + lVar52);
          uVar46 = (ulong)*(uint *)(lVar47 + 4 + lVar52);
          lVar16 = *(long *)&pGVar15[2].numPrimitives;
          lVar49 = (long)(int)fVar82 * 0x38;
          lVar17 = *(long *)(lVar16 + lVar49);
          lVar50 = *(long *)(lVar16 + 0x10 + lVar49);
          auVar83 = *(undefined1 (*) [16])(lVar17 + lVar50 * uVar42);
          auVar88 = *(undefined1 (*) [16])(lVar17 + lVar50 * uVar46);
          uVar45 = (ulong)*(uint *)(lVar47 + 8 + lVar52);
          auVar57 = *(undefined1 (*) [16])(lVar17 + lVar50 * uVar45);
          auVar56 = minps(auVar83,auVar88);
          auVar56 = minps(auVar56,auVar57);
          auVar83 = maxps(auVar83,auVar88);
          auVar71 = maxps(auVar83,auVar57);
          lVar50 = (long)(int)fVar61 * 0x38;
          lVar47 = *(long *)(lVar16 + lVar50);
          lVar17 = *(long *)(lVar16 + 0x10 + lVar50);
          auVar83 = *(undefined1 (*) [16])(lVar47 + lVar17 * uVar42);
          auVar88 = *(undefined1 (*) [16])(lVar47 + lVar17 * uVar46);
          auVar57 = *(undefined1 (*) [16])(lVar47 + lVar17 * uVar45);
          auVar59 = minps(auVar83,auVar88);
          auVar59 = minps(auVar59,auVar57);
          auVar83 = maxps(auVar83,auVar88);
          auVar83 = maxps(auVar83,auVar57);
          fVar82 = fVar87 * fVar89 - fVar82;
          fVar66 = auVar59._0_4_;
          fVar86 = auVar56._0_4_;
          fVar74 = auVar83._0_4_;
          fVar75 = auVar83._4_4_;
          fVar76 = auVar83._8_4_;
          fVar78 = auVar83._12_4_;
          fVar70 = auVar71._0_4_;
          fVar77 = auVar71._4_4_;
          fVar80 = auVar71._8_4_;
          fVar73 = auVar71._12_4_;
          fVar62 = auVar56._4_4_;
          fVar64 = auVar56._8_4_;
          fVar65 = auVar56._12_4_;
          fVar67 = auVar59._4_4_;
          fVar68 = auVar59._8_4_;
          fVar69 = auVar59._12_4_;
          if (uVar18 - iVar29 == 1) {
            if (fVar82 <= 0.0) {
              fVar82 = 0.0;
            }
            fVar91 = 1.0 - fVar82;
            auVar57._4_4_ = fVar91 * fVar62 + fVar82 * fVar67;
            auVar57._0_4_ = fVar91 * fVar86 + fVar82 * fVar66;
            auVar71._0_4_ = fVar91 * fVar70 + fVar82 * fVar74;
            auVar71._4_4_ = fVar91 * fVar77 + fVar82 * fVar75;
            auVar71._8_4_ = fVar91 * fVar80 + fVar82 * fVar76;
            auVar71._12_4_ = fVar91 * fVar73 + fVar82 * fVar78;
            fVar87 = fVar61 - fVar90;
            if (fVar61 - fVar90 <= 0.0) {
              fVar87 = 0.0;
            }
            fVar89 = 1.0 - fVar87;
            auVar56._0_4_ = fVar66 * fVar89 + fVar86 * fVar87;
            auVar56._4_4_ = fVar67 * fVar89 + fVar62 * fVar87;
            auVar56._8_4_ = fVar68 * fVar89 + fVar64 * fVar87;
            auVar56._12_4_ = fVar69 * fVar89 + fVar65 * fVar87;
            auVar59._0_4_ = fVar89 * fVar74 + fVar87 * fVar70;
            auVar59._4_4_ = fVar89 * fVar75 + fVar87 * fVar77;
            auVar59._8_4_ = fVar89 * fVar76 + fVar87 * fVar80;
            auVar59._12_4_ = fVar89 * fVar78 + fVar87 * fVar73;
            auVar57._8_4_ = fVar91 * fVar64 + fVar82 * fVar68;
            auVar57._12_4_ = fVar91 * fVar65 + fVar82 * fVar69;
          }
          else {
            lVar47 = *(long *)(lVar16 + 0x38 + lVar49);
            lVar17 = *(long *)(lVar16 + 0x48 + lVar49);
            auVar83 = *(undefined1 (*) [16])(lVar47 + lVar17 * uVar42);
            auVar88 = *(undefined1 (*) [16])(lVar47 + lVar17 * uVar46);
            auVar57 = *(undefined1 (*) [16])(lVar47 + lVar17 * uVar45);
            auVar56 = minps(auVar83,auVar88);
            auVar71 = minps(auVar56,auVar57);
            auVar83 = maxps(auVar83,auVar88);
            auVar56 = maxps(auVar83,auVar57);
            lVar47 = *(long *)(lVar16 + -0x38 + lVar50);
            lVar17 = *(long *)(lVar16 + -0x28 + lVar50);
            auVar83 = *(undefined1 (*) [16])(lVar47 + lVar17 * uVar42);
            auVar88 = *(undefined1 (*) [16])(lVar47 + lVar17 * uVar46);
            auVar57 = *(undefined1 (*) [16])(lVar47 + lVar17 * uVar45);
            auVar59 = minps(auVar83,auVar88);
            auVar59 = minps(auVar59,auVar57);
            auVar83 = maxps(auVar83,auVar88);
            auVar83 = maxps(auVar83,auVar57);
            if (fVar82 <= 0.0) {
              fVar82 = 0.0;
            }
            fVar63 = 1.0 - fVar82;
            auVar57._0_4_ = fVar86 * fVar63 + auVar71._0_4_ * fVar82;
            auVar57._4_4_ = fVar62 * fVar63 + auVar71._4_4_ * fVar82;
            auVar57._8_4_ = fVar64 * fVar63 + auVar71._8_4_ * fVar82;
            auVar57._12_4_ = fVar65 * fVar63 + auVar71._12_4_ * fVar82;
            auVar71._0_4_ = fVar63 * fVar70 + fVar82 * auVar56._0_4_;
            auVar71._4_4_ = fVar63 * fVar77 + fVar82 * auVar56._4_4_;
            auVar71._8_4_ = fVar63 * fVar80 + fVar82 * auVar56._8_4_;
            auVar71._12_4_ = fVar63 * fVar73 + fVar82 * auVar56._12_4_;
            fVar82 = fVar61 - fVar90;
            if (fVar61 - fVar90 <= 0.0) {
              fVar82 = 0.0;
            }
            fVar86 = 1.0 - fVar82;
            auVar56._0_4_ = fVar66 * fVar86 + auVar59._0_4_ * fVar82;
            auVar56._4_4_ = fVar67 * fVar86 + auVar59._4_4_ * fVar82;
            auVar56._8_4_ = fVar68 * fVar86 + auVar59._8_4_ * fVar82;
            auVar56._12_4_ = fVar69 * fVar86 + auVar59._12_4_ * fVar82;
            auVar59._0_4_ = fVar86 * fVar74 + fVar82 * auVar83._0_4_;
            auVar59._4_4_ = fVar86 * fVar75 + fVar82 * auVar83._4_4_;
            auVar59._8_4_ = fVar86 * fVar76 + fVar82 * auVar83._8_4_;
            auVar59._12_4_ = fVar86 * fVar78 + fVar82 * auVar83._12_4_;
            uVar43 = iVar29 + 1;
            if ((int)uVar43 < (int)uVar18) {
              plVar48 = (long *)(lVar16 + (ulong)uVar43 * 0x38 + 0x10);
              do {
                fVar70 = ((float)(int)uVar43 / fVar87 - fVar89) / (fVar91 - fVar89);
                fVar82 = 1.0 - fVar70;
                fVar61 = auVar56._4_4_;
                fVar62 = auVar56._12_4_;
                fVar77 = auVar56._8_4_;
                fVar86 = auVar57._4_4_;
                fVar90 = auVar57._12_4_;
                fVar80 = auVar57._8_4_;
                fVar67 = auVar59._4_4_;
                fVar68 = auVar59._8_4_;
                fVar69 = auVar59._12_4_;
                fVar64 = auVar71._4_4_;
                fVar65 = auVar71._8_4_;
                fVar66 = auVar71._12_4_;
                lVar47 = plVar48[-2];
                lVar16 = *plVar48;
                auVar83 = *(undefined1 (*) [16])(lVar47 + lVar16 * uVar42);
                auVar88 = *(undefined1 (*) [16])(lVar47 + lVar16 * uVar46);
                auVar72 = *(undefined1 (*) [16])(lVar47 + lVar16 * uVar45);
                auVar84 = minps(auVar83,auVar88);
                auVar84 = minps(auVar84,auVar72);
                auVar85._0_4_ = auVar84._0_4_ - (auVar57._0_4_ * fVar82 + auVar56._0_4_ * fVar70);
                auVar85._4_4_ = auVar84._4_4_ - (fVar86 * fVar82 + fVar61 * fVar70);
                auVar85._8_4_ = auVar84._8_4_ - (fVar80 * fVar82 + fVar77 * fVar70);
                auVar85._12_4_ = auVar84._12_4_ - (fVar90 * fVar82 + fVar62 * fVar70);
                auVar83 = maxps(auVar83,auVar88);
                auVar83 = maxps(auVar83,auVar72);
                auVar72._0_4_ = auVar83._0_4_ - (fVar82 * auVar71._0_4_ + fVar70 * auVar59._0_4_);
                auVar72._4_4_ = auVar83._4_4_ - (fVar82 * fVar64 + fVar70 * fVar67);
                auVar72._8_4_ = auVar83._8_4_ - (fVar82 * fVar65 + fVar70 * fVar68);
                auVar72._12_4_ = auVar83._12_4_ - (fVar82 * fVar66 + fVar70 * fVar69);
                auVar88 = minps(auVar85,ZEXT816(0));
                auVar83 = maxps(auVar72,ZEXT816(0));
                auVar57._0_4_ = auVar57._0_4_ + auVar88._0_4_;
                auVar57._4_4_ = fVar86 + auVar88._4_4_;
                auVar57._8_4_ = fVar80 + auVar88._8_4_;
                auVar57._12_4_ = fVar90 + auVar88._12_4_;
                auVar56._0_4_ = auVar56._0_4_ + auVar88._0_4_;
                auVar56._4_4_ = fVar61 + auVar88._4_4_;
                auVar56._8_4_ = fVar77 + auVar88._8_4_;
                auVar56._12_4_ = fVar62 + auVar88._12_4_;
                auVar71._0_4_ = auVar71._0_4_ + auVar83._0_4_;
                auVar71._4_4_ = fVar64 + auVar83._4_4_;
                auVar71._8_4_ = fVar65 + auVar83._8_4_;
                auVar71._12_4_ = fVar66 + auVar83._12_4_;
                auVar59._0_4_ = auVar59._0_4_ + auVar83._0_4_;
                auVar59._4_4_ = fVar67 + auVar83._4_4_;
                auVar59._8_4_ = fVar68 + auVar83._8_4_;
                auVar59._12_4_ = fVar69 + auVar83._12_4_;
                uVar43 = uVar43 + 1;
                plVar48 = plVar48 + 7;
              } while (uVar18 != uVar43);
            }
          }
          auVar81 = minps(auVar81,auVar57);
          auVar79 = maxps(auVar79,auVar71);
          auVar58 = minps(auVar58,auVar56);
          auVar60 = maxps(auVar60,auVar59);
          lVar54 = lVar54 + 1;
        } while (lVar54 != 4);
        local_1b78 = maxps(local_1b78,auVar60);
        local_1b68._0_16_ = minps(local_1b68._0_16_,auVar58);
        local_1b88 = maxps(local_1b88,auVar79);
        local_17d8 = minps(local_17d8,auVar81);
        lVar30 = lVar30 + 1;
      } while (lVar30 != uVar34 + (uVar34 == 0));
    }
    (__return_storage_ptr__->ref).ptr = uVar44 | (ulong)pcVar41 | 8;
    *(undefined1 (*) [16])(__return_storage_ptr__->lbounds).bounds0.lower.field_0.m128 = local_17d8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1b88._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1b88._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1b68._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1b68._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1b78._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_1b78._8_8_;
    __return_storage_ptr__->dt = BStack_1830;
    return __return_storage_ptr__;
  }
  lVar30 = 0xbc;
  do {
    *(undefined8 *)(local_17d8 + lVar30 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(local_17d8 + lVar30 + 0xc) = 0;
    lVar30 = lVar30 + 0xf0;
  } while (lVar30 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  local_1768._0_8_ = local_1dd8[0]._0_8_;
  local_1768._8_8_ = local_1dd8[0]._8_8_;
  local_1758[0] = uVar53;
  local_1758[1] = uVar42;
  local_1748[0] = values[0].ref.ptr;
  local_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar5;
  local_1718._0_8_ = v0.field_0.v[0];
  local_1718._8_8_ = v0.field_0.v[1];
  local_1708[0] = local_17b8._0_8_;
  local_1708[2] = local_17a8._0_8_;
  local_1708[3] = local_17a8._8_8_;
  local_16e8 = local_1798._0_8_;
  uStack_16e0 = local_1798._8_8_;
  local_840 = BVar5;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1e38._8_8_ = 0x7f8000007f800000;
  local_1e38._0_8_ = 0x7f8000007f800000;
  local_1df8._8_8_ = 0xff800000ff800000;
  local_1df8._0_8_ = 0xff800000ff800000;
  bVar25 = false;
  v0.field_0.v[0] = uVar34;
  local_17b8._0_8_ = sVar36;
  local_17b8._8_8_ = uVar19;
  local_17a8 = (undefined1  [16])aVar20;
  local_1798 = (undefined1  [16])aVar21;
  local_1788 = aVar22;
  local_1778 = aVar24;
  do {
    if (local_848 == 0) {
      uVar53 = 0xffffffffffffffff;
    }
    else {
      uVar53 = 0xffffffffffffffff;
      puVar39 = local_1758;
      uVar42 = 0;
      uVar44 = 0;
      do {
        uVar46 = puVar39[1] - *puVar39;
        if ((((this->cfg).maxLeafSize < uVar46) || (1 < *(uint *)((long)puVar39 + 0x4c))) ||
           (bVar23)) {
          if (uVar42 < uVar46) {
            uVar53 = uVar44;
            uVar42 = uVar46;
          }
          bVar23 = false;
        }
        uVar44 = uVar44 + 1;
        puVar39 = puVar39 + 0x1e;
      } while (local_848 != uVar44);
    }
    if (uVar53 != 0xffffffffffffffff) {
      lVar30 = uVar53 * 0xf0;
      v2.field_0.v[0] = uVar34 + 1;
      local_1be8 = 0xffffffff7f800000;
      sStack_1be0 = 0;
      local_1a98 = 0xffffffff7f800000;
      sStack_1a90 = 0;
      pSVar3 = (Split *)(local_1718 + uVar53 * 0xf0);
      iVar29 = *(int *)((long)local_1708 + lVar30 + -4);
      geomID.field_0.v[0] = v2.field_0.v[0];
      if (iVar29 == 0) {
        sVar36 = local_1758[uVar53 * 0x1e];
        end = local_1758[uVar53 * 0x1e + 1];
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        left.max_time_range.lower = 0.0;
        left.num_time_segments = 0;
        left.max_num_time_segments = 0;
        left.object_range._begin = 0;
        left.object_range._end = 0;
        left.max_time_range.upper = 1.0;
        left.time_range.lower = 1.0;
        left.time_range.upper = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        right.max_time_range.lower = 0.0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.max_time_range.upper = 1.0;
        right.time_range.lower = 1.0;
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = (int)local_1708[uVar53 * 0x1e + -1];
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar31 = (long)(1 << (local_1718[lVar30 + 4] & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar31);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar31 + 8);
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        isLeft.split = pSVar3;
        sStack_1c20 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                (*(PrimRefMB **)((long)local_1728[uVar53 * 0x1e] + 0x20),sVar36,end,
                                 (EmptyTy *)local_19e8,&left,&right,&isLeft,&reduction,&reduction2,
                                 0x80,0xc00);
        local_1bf8 = local_1728[uVar53 * 0x1e];
        BVar5 = local_1728[uVar53 * 0x1e + -1];
        local_1c58._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        local_1c58._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        local_1c88._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1c88._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1c78._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1c78._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        local_1c68._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        local_1c68._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        local_1c48.lower =
             (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _0_4_;
        local_1c48.upper =
             (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _4_4_;
        acStack_1c40[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_1_;
        acStack_1c40[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._9_1_;
        acStack_1c40[2] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._10_1_;
        acStack_1c40[3] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._11_1_;
        acStack_1c40[4] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._12_1_;
        acStack_1c40[5] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._13_1_;
        acStack_1c40[6] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._14_1_;
        acStack_1c40[7] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._15_1_;
        local_1c38[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_1_;
        local_1c38[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._1_1_;
        local_1c38[2] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._2_1_;
        local_1c38[3] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._3_1_;
        local_1c38[4] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._4_1_;
        local_1c38[5] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._5_1_;
        local_1c38[6] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._6_1_;
        local_1c38[7] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._7_1_;
        uStack_1c30 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                      _8_8_;
        local_1c08.upper = left.max_time_range.upper;
        local_1c08.lower = left.max_time_range.lower;
        local_1c18 = left.num_time_segments;
        sStack_1c10 = left.max_num_time_segments;
        fVar87 = BVar5.lower;
        BStack_1c00.lower = fVar87;
        if (fVar87 <= left.time_range.lower) {
          BStack_1c00.lower = left.time_range.lower;
        }
        fVar82 = BVar5.upper;
        BStack_1c00.upper = left.time_range.upper;
        if (fVar82 <= left.time_range.upper) {
          BStack_1c00.upper = fVar82;
        }
        local_1b38._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b38._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b28 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                     field_0._0_8_;
        BStack_1b20.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._8_4_;
        BStack_1b20.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._12_4_;
        local_1b18.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._0_4_;
        local_1b18.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._4_4_;
        uStack_1b10 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                      field_0._8_8_;
        local_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                     field_0._0_8_;
        uStack_1b00 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0._8_8_;
        local_1af8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                     _0_8_;
        uStack_1af0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                      _8_8_;
        local_1ae8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
        local_1ae8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
        local_1ab8.lower = right.max_time_range.lower;
        BStack_1ab0.lower = right.time_range.lower;
        local_1ac8 = right.num_time_segments;
        sStack_1ac0 = right.max_num_time_segments;
        if (fVar87 <= BStack_1ab0.lower) {
          BVar5 = (BBox1f)((ulong)BStack_1ab0 & 0xffffffff);
        }
        if (fVar82 <= BStack_1ab0.upper) {
          BStack_1ab0.upper = fVar82;
        }
        BStack_1ab0.lower = BVar5.lower;
        local_1c28 = sVar36;
        local_1ad8 = sStack_1c20;
        sStack_1ad0 = end;
        local_1aa8 = local_1bf8;
LAB_00d25394:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_00 = &local_17b8 + uVar53 * 0xf;
        if (iVar29 != 2) {
          if (iVar29 == 1) {
            SetMB::deterministic_order((SetMB *)&this_00->field_1);
            splitFallback(this,(SetMB *)&this_00->field_1,(SetMB *)&local_1c88.field_1,
                          (SetMB *)&local_1b38.field_1);
          }
          else if (iVar29 == 3) {
            SetMB::deterministic_order((SetMB *)&this_00->field_1);
            splitByGeometry(this,(SetMB *)&this_00->field_1,(SetMB *)&local_1c88.field_1,
                            (SetMB *)&local_1b38.field_1);
          }
          goto LAB_00d25394;
        }
        time_range1.lower = *(float *)(local_1708 + uVar53 * 0x1e + -1);
        time_range0.lower = local_1728[uVar53 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar53 * 0x1e + -1].upper;
        BVar5 = local_1728[uVar53 * 0x1e];
        time_range0.upper = time_range1.lower;
        BVar32 = (BBox1f)operator_new(0x28);
        pMVar6 = (this->heuristicTemporalSplit).device;
        uVar42 = local_1758[uVar53 * 0x1e + 1];
        *(MemoryMonitorInterface **)BVar32 = pMVar6;
        *(undefined1 *)((long)BVar32 + 8) = 0;
        *(long *)((long)BVar32 + 0x10) = 0;
        *(long *)((long)BVar32 + 0x18) = 0;
        *(long *)((long)BVar32 + 0x20) = 0;
        lVar31 = uVar42 - local_1758[uVar53 * 0x1e];
        if (lVar31 != 0) {
          uVar42 = lVar31 * 0x50;
          local_1a58 = this_00;
          (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,uVar42,0);
          if (uVar42 < 0x1c00000) {
            pvVar33 = alignedMalloc(uVar42,0x10);
          }
          else {
            pvVar33 = os_malloc(uVar42,(bool *)((long)BVar32 + 8));
          }
          *(void **)((long)BVar32 + 0x20) = pvVar33;
          *(long *)((long)BVar32 + 0x10) = lVar31;
          *(long *)((long)BVar32 + 0x18) = lVar31;
        }
        pvVar26 = isLeft.vSplitPos;
        vSplitMask.field_0._8_8_ = &time_range0;
        pSVar7 = (Split *)local_1758[uVar53 * 0x1e];
        pvVar8 = (vint *)local_1758[uVar53 * 0x1e + 1];
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        right.max_time_range.lower = 0.0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.max_time_range.upper = 1.0;
        right.time_range.lower = 1.0;
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )BVar32;
        vSplitMask.field_0._0_8_ = BVar5;
        if ((ulong)((long)pvVar8 - (long)pSVar7) < 0xc00) {
          isLeft.split = pSVar7;
          isLeft.vSplitPos = pvVar8;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar26,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)pvVar8;
          vSplitPos.field_0.v[1] = (longlong)pSVar7;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,in_stack_ffffffffffffe168);
          cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar28 != '\0') {
            prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar38,"task cancelled");
            __cxa_throw(prVar38,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if (left.object_range._end - left.object_range._begin !=
            local_1758[uVar53 * 0x1e + 1] - local_1758[uVar53 * 0x1e]) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          left.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                         (*(PrimRefMB **)((long)BVar32 + 0x20),0,
                          local_1758[uVar53 * 0x1e + 1] - local_1758[uVar53 * 0x1e],0x400,
                          (anon_class_8_1_41ce32a5 *)&right);
        }
        uVar19 = vSplitPos.field_0.v[1];
        local_1c18 = left.num_time_segments;
        sStack_1c10 = left.max_num_time_segments;
        local_1c88._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1c88._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1c78._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1c78._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        local_1c68._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        local_1c68._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        local_1c58._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        local_1c58._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        local_1c48.lower =
             (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _0_4_;
        local_1c48.upper =
             (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _4_4_;
        acStack_1c40[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_1_;
        acStack_1c40[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._9_1_;
        acStack_1c40[2] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._10_1_;
        acStack_1c40[3] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._11_1_;
        acStack_1c40[4] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._12_1_;
        acStack_1c40[5] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._13_1_;
        acStack_1c40[6] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._14_1_;
        acStack_1c40[7] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._15_1_;
        local_1c38[0] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_1_;
        local_1c38[1] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._1_1_;
        local_1c38[2] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._2_1_;
        local_1c38[3] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._3_1_;
        local_1c38[4] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._4_1_;
        local_1c38[5] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._5_1_;
        local_1c38[6] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._6_1_;
        local_1c38[7] =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._7_1_;
        uStack_1c30 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                      _8_8_;
        local_1c28 = left.object_range._begin;
        sStack_1c20 = left.object_range._end;
        local_1c08.upper = left.max_time_range.upper;
        local_1c08.lower = left.max_time_range.lower;
        BStack_1c00 = (BBox1f)(CONCAT44(~-(uint)(left.time_range.upper < time_range0.upper) &
                                        (uint)time_range0.upper,
                                        ~-(uint)(left.time_range.lower < time_range0.lower) &
                                        (uint)left.time_range.lower) |
                              CONCAT44((uint)left.time_range.upper &
                                       -(uint)(left.time_range.upper < time_range0.upper),
                                       (uint)time_range0.lower &
                                       -(uint)(left.time_range.lower < time_range0.lower)));
        pcVar9 = (code *)local_1758[uVar53 * 0x1e + 1];
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        local_1bf8 = BVar32;
        _reduction2 = BVar5;
        if ((long)pcVar9 - local_1758[uVar53 * 0x1e] < 0xc00) {
          vSplitPos.field_0.v[0] = local_1758[uVar53 * 0x1e];
          vSplitPos.field_0.v[1] = (longlong)pcVar9;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar19,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19e8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19e8._8_8_ = &reduction2;
          _reduction = pcVar9;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19e8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,in_stack_ffffffffffffe168);
          cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar28 != '\0') {
            prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar38,"task cancelled");
            __cxa_throw(prVar38,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar31 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = local_1758[uVar53 * 0x1e];
        right.object_range._end = lVar31 + right.object_range._begin;
        if (lVar31 != local_1758[uVar53 * 0x1e + 1] - right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)BVar5 + 0x20),right.object_range._begin,
                          local_1758[uVar53 * 0x1e + 1],0x400,(anon_class_8_1_41ce32a6 *)&isLeft);
        }
        local_1b38._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b38._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b28 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                     field_0._0_8_;
        BStack_1b20.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._8_4_;
        BStack_1b20.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._12_4_;
        local_1b18.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._0_4_;
        local_1b18.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._4_4_;
        uStack_1b10 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                      field_0._8_8_;
        local_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                     field_0._0_8_;
        uStack_1b00 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0._8_8_;
        local_1af8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                     _0_8_;
        uStack_1af0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                      _8_8_;
        local_1ae8._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
        local_1ae8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
        sStack_1ac0 = right.max_num_time_segments;
        local_1ac8 = right.num_time_segments;
        local_1ad8 = right.object_range._begin;
        sStack_1ad0 = right.object_range._end;
        local_1ab8.upper = right.max_time_range.upper;
        local_1ab8.lower = right.max_time_range.lower;
        BStack_1ab0 = (BBox1f)(CONCAT44(~-(uint)(right.time_range.upper < time_range1.upper) &
                                        (uint)time_range1.upper,
                                        ~-(uint)(right.time_range.lower < time_range1.lower) &
                                        (uint)right.time_range.lower) |
                              CONCAT44((uint)right.time_range.upper &
                                       -(uint)(right.time_range.upper < time_range1.upper),
                                       (uint)time_range1.lower &
                                       -(uint)(right.time_range.lower < time_range1.lower)));
        local_1aa8 = BVar5;
      }
      bVar55 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&left,this,(SetMB *)&local_1c88.field_1);
      local_1bd8 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      local_1bc8 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                   field_0._0_8_;
      sStack_1bc0 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._8_8_;
      local_1bb8 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                   field_0._0_8_;
      sStack_1bb0 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      findFallback((Split *)&left,this,(SetMB *)&local_1b38.field_1);
      lVar31 = local_640;
      local_1a88 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      local_1a78 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                   field_0._0_8_;
      sStack_1a70 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._8_8_;
      local_1a68 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                   field_0._0_8_;
      sStack_1a60 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar51 = local_8c8[uVar53];
      if (local_1bf8 == *pBVar51) {
        pBVar51[1] = (BBox1f)((long)pBVar51[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar31 * 2 + -1] = local_1bf8;
        local_838[lVar31 * 2].lower = 1.4013e-45;
        local_838[lVar31 * 2].upper = 0.0;
        local_8c8[uVar53] = local_838 + lVar31 * 2 + -1;
      }
      lVar31 = local_640;
      if (local_1aa8 == *pBVar51) {
        local_8c8[local_848] = pBVar51;
        pBVar51[1] = (BBox1f)((long)pBVar51[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar31 * 2 + -1] = local_1aa8;
        local_838[lVar31 * 2].lower = 1.4013e-45;
        local_838[lVar31 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar31 * 2 + -1;
      }
      pBVar12 = pBVar51 + 1;
      *pBVar12 = (BBox1f)((long)*pBVar12 + -1);
      if ((*pBVar12 == (BBox1f)0x0) && (BVar5 = *pBVar51, BVar5 != (BBox1f)0x0)) {
        lVar31 = *(long *)((long)BVar5 + 0x18);
        pvVar33 = *(void **)((long)BVar5 + 0x20);
        if (pvVar33 != (void *)0x0) {
          if ((ulong)(lVar31 * 0x50) < 0x1c00000) {
            alignedFree(pvVar33);
          }
          else {
            os_free(pvVar33,lVar31 * 0x50,*(bool *)((long)BVar5 + 8));
          }
        }
        if (lVar31 != 0) {
          (**(code **)**(undefined8 **)BVar5)(*(undefined8 **)BVar5,lVar31 * -0x50,1);
        }
        *(undefined8 *)((long)BVar5 + 0x10) = 0;
        *(undefined8 *)((long)BVar5 + 0x18) = 0;
        *(undefined8 *)((long)BVar5 + 0x20) = 0;
        operator_delete((void *)BVar5);
      }
      uVar42 = local_848;
      (&v0)[uVar53 * 0xf].field_0.v[0] = v2.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar53 * 0xf) = local_1c88._0_8_;
      *(undefined8 *)(local_17a8 + lVar30 + -8) = local_1c88._8_8_;
      ((BBox1f *)(local_17a8 + lVar30))->lower = (float)local_1c78._0_4_;
      ((BBox1f *)(local_17a8 + lVar30))->upper = local_1c78.m128[1];
      ((BBox1f *)(local_17a8 + lVar30 + 8))->lower = (float)local_1c78._8_4_;
      ((BBox1f *)(local_17a8 + lVar30 + 8))->upper = local_1c78.m128[3];
      ((BBox1f *)(local_1798 + lVar30))->lower = (float)local_1c68._0_4_;
      ((BBox1f *)(local_1798 + lVar30))->upper = local_1c68.m128[1];
      ((BBox1f *)(local_1798 + lVar30 + 8))->lower = (float)local_1c68._8_4_;
      ((BBox1f *)(local_1798 + lVar30 + 8))->upper = local_1c68.m128[3];
      *(undefined8 *)(&local_1788 + uVar53 * 0xf) = local_1c58._0_8_;
      *(undefined8 *)((long)&local_1788 + lVar30 + 8) = local_1c58._8_8_;
      *(BBox1f *)((long)&local_1778 + uVar53 * 0xf0) = local_1c48;
      *(char (*) [8])((long)&local_1778 + lVar30 + 8U) = acStack_1c40;
      *(char (*) [8])(&local_1768 + uVar53 * 0xf) = local_1c38;
      local_1758[uVar53 * 0x1e + -1] = uStack_1c30;
      local_1758[uVar53 * 0x1e] = local_1c28;
      local_1758[uVar53 * 0x1e + 1] = sStack_1c20;
      local_1748[uVar53 * 0x1e] = local_1c18;
      local_1748[uVar53 * 0x1e + 1] = sStack_1c10;
      (&local_1738)[uVar53 * 0x1e] = local_1c08;
      local_1728[uVar53 * 0x1e + -1] = BStack_1c00;
      local_1728[uVar53 * 0x1e] = local_1bf8;
      pSVar3->sah = (float)(undefined4)local_1be8;
      pSVar3->dim = local_1be8._4_4_;
      local_1708[uVar53 * 0x1e + -1] = sStack_1be0;
      local_1708[uVar53 * 0x1e] = local_1bd8;
      local_1708[uVar53 * 0x1e + 2] = local_1bc8;
      local_1708[uVar53 * 0x1e + 3] = sStack_1bc0;
      local_1708[uVar53 * 0x1e + 4] = local_1bb8;
      local_1708[uVar53 * 0x1e + 5] = sStack_1bb0;
      lVar30 = local_848 * 0xf0;
      (&v0)[local_848 * 0xf].field_0.v[0] = geomID.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar42 * 0xf) = local_1b38._0_8_;
      *(undefined8 *)(local_17a8 + lVar30 + -8) = local_1b38._8_8_;
      *(size_t *)(local_17a8 + lVar30) = local_1b28;
      *(BBox1f *)(local_17a8 + lVar30 + 8) = BStack_1b20;
      *(BBox1f *)(local_1798 + lVar30) = local_1b18;
      *(undefined8 *)(local_1798 + lVar30 + 8) = uStack_1b10;
      *(undefined8 *)(&local_1788 + uVar42 * 0xf) = local_1b08;
      *(undefined8 *)((long)&local_1788 + lVar30 + 8) = uStack_1b00;
      *(undefined8 *)((long)&local_1778 + uVar42 * 0xf0) = local_1af8;
      *(undefined8 *)((long)&local_1778 + lVar30 + 8U) = uStack_1af0;
      *(undefined8 *)(&local_1768 + uVar42 * 0xf) = local_1ae8._0_8_;
      local_1758[uVar42 * 0x1e + -1] = local_1ae8._8_8_;
      local_1758[uVar42 * 0x1e] = local_1ad8;
      local_1758[uVar42 * 0x1e + 1] = sStack_1ad0;
      local_1748[uVar42 * 0x1e] = local_1ac8;
      local_1748[uVar42 * 0x1e + 1] = sStack_1ac0;
      (&local_1738)[uVar42 * 0x1e] = local_1ab8;
      local_1728[uVar42 * 0x1e + -1] = BStack_1ab0;
      local_1728[uVar42 * 0x1e] = local_1aa8;
      *(undefined8 *)(local_1718 + uVar42 * 0xf0) = local_1a98;
      local_1708[uVar42 * 0x1e + -1] = sStack_1a90;
      local_1708[uVar42 * 0x1e] = local_1a88;
      local_1708[uVar42 * 0x1e + 2] = local_1a78;
      local_1708[uVar42 * 0x1e + 3] = sStack_1a70;
      local_1708[uVar42 * 0x1e + 4] = local_1a68;
      local_1708[uVar42 * 0x1e + 5] = sStack_1a60;
      local_848 = local_848 + 1;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar25 = (bool)(bVar25 | bVar55);
    }
  } while ((uVar53 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    pfVar35 = &fStack_172c;
    uVar34 = local_848;
    do {
      bVar25 = (bool)(bVar25 | (*pfVar35 < (in->prims).super_PrimInfoMB.time_range.upper ||
                               (in->prims).super_PrimInfoMB.time_range.lower < pfVar35[-1]));
      pfVar35 = pfVar35 + 0x3c;
      uVar34 = uVar34 - 1;
    } while (uVar34 != 0);
  }
  if (!bVar25) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar10 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      geomID.field_0.v[1]._0_1_ = 1;
      geomID.field_0.v[0] = (longlong)pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar10->alloc0).bytesUsed = 0;
      (pTVar10->alloc0).bytesWasted = 0;
      (pTVar10->alloc0).end = 0;
      (pTVar10->alloc0).allocBlockSize = 0;
      (pTVar10->alloc0).ptr = (char *)0x0;
      (pTVar10->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      v2.field_0.v[1]._0_1_ = 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&left);
      }
      else {
        *iVar11._M_current =
             (ThreadLocal2 *)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (v2.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v2.field_0.v[0]);
      }
      if (geomID.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar36 = (alloc.talloc0)->cur;
    uVar34 = (ulong)(-(int)sVar36 & 0xf);
    uVar53 = sVar36 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar34;
    (alloc.talloc0)->cur = uVar53;
    if ((alloc.talloc0)->end < uVar53) {
      (alloc.talloc0)->cur = sVar36;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar41;
        sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar36;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
          (alloc.talloc0)->ptr = pcVar41;
          sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar36;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = v2.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v2.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_00d264ec;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar36;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar34;
      pcVar41 = (alloc.talloc0)->ptr +
                (uVar53 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00d264ec:
    pcVar41[0x60] = '\0';
    pcVar41[0x61] = '\0';
    pcVar41[0x62] = -0x80;
    pcVar41[99] = '\x7f';
    pcVar41[100] = '\0';
    pcVar41[0x65] = '\0';
    pcVar41[0x66] = -0x80;
    pcVar41[0x67] = '\x7f';
    pcVar41[0x68] = '\0';
    pcVar41[0x69] = '\0';
    pcVar41[0x6a] = -0x80;
    pcVar41[0x6b] = '\x7f';
    pcVar41[0x6c] = '\0';
    pcVar41[0x6d] = '\0';
    pcVar41[0x6e] = -0x80;
    pcVar41[0x6f] = '\x7f';
    pcVar41[0x40] = '\0';
    pcVar41[0x41] = '\0';
    pcVar41[0x42] = -0x80;
    pcVar41[0x43] = '\x7f';
    pcVar41[0x44] = '\0';
    pcVar41[0x45] = '\0';
    pcVar41[0x46] = -0x80;
    pcVar41[0x47] = '\x7f';
    pcVar41[0x48] = '\0';
    pcVar41[0x49] = '\0';
    pcVar41[0x4a] = -0x80;
    pcVar41[0x4b] = '\x7f';
    pcVar41[0x4c] = '\0';
    pcVar41[0x4d] = '\0';
    pcVar41[0x4e] = -0x80;
    pcVar41[0x4f] = '\x7f';
    pcVar41[0x20] = '\0';
    pcVar41[0x21] = '\0';
    pcVar41[0x22] = -0x80;
    pcVar41[0x23] = '\x7f';
    pcVar41[0x24] = '\0';
    pcVar41[0x25] = '\0';
    pcVar41[0x26] = -0x80;
    pcVar41[0x27] = '\x7f';
    pcVar41[0x28] = '\0';
    pcVar41[0x29] = '\0';
    pcVar41[0x2a] = -0x80;
    pcVar41[0x2b] = '\x7f';
    pcVar41[0x2c] = '\0';
    pcVar41[0x2d] = '\0';
    pcVar41[0x2e] = -0x80;
    pcVar41[0x2f] = '\x7f';
    pcVar41[0x70] = '\0';
    pcVar41[0x71] = '\0';
    pcVar41[0x72] = -0x80;
    pcVar41[0x73] = -1;
    pcVar41[0x74] = '\0';
    pcVar41[0x75] = '\0';
    pcVar41[0x76] = -0x80;
    pcVar41[0x77] = -1;
    pcVar41[0x78] = '\0';
    pcVar41[0x79] = '\0';
    pcVar41[0x7a] = -0x80;
    pcVar41[0x7b] = -1;
    pcVar41[0x7c] = '\0';
    pcVar41[0x7d] = '\0';
    pcVar41[0x7e] = -0x80;
    pcVar41[0x7f] = -1;
    pcVar41[0x50] = '\0';
    pcVar41[0x51] = '\0';
    pcVar41[0x52] = -0x80;
    pcVar41[0x53] = -1;
    pcVar41[0x54] = '\0';
    pcVar41[0x55] = '\0';
    pcVar41[0x56] = -0x80;
    pcVar41[0x57] = -1;
    pcVar41[0x58] = '\0';
    pcVar41[0x59] = '\0';
    pcVar41[0x5a] = -0x80;
    pcVar41[0x5b] = -1;
    pcVar41[0x5c] = '\0';
    pcVar41[0x5d] = '\0';
    pcVar41[0x5e] = -0x80;
    pcVar41[0x5f] = -1;
    pcVar41[0x30] = '\0';
    pcVar41[0x31] = '\0';
    pcVar41[0x32] = -0x80;
    pcVar41[0x33] = -1;
    pcVar41[0x34] = '\0';
    pcVar41[0x35] = '\0';
    pcVar41[0x36] = -0x80;
    pcVar41[0x37] = -1;
    pcVar41[0x38] = '\0';
    pcVar41[0x39] = '\0';
    pcVar41[0x3a] = -0x80;
    pcVar41[0x3b] = -1;
    pcVar41[0x3c] = '\0';
    pcVar41[0x3d] = '\0';
    pcVar41[0x3e] = -0x80;
    pcVar41[0x3f] = -1;
    pcVar41[0x80] = '\0';
    pcVar41[0x81] = '\0';
    pcVar41[0x82] = '\0';
    pcVar41[0x83] = '\0';
    pcVar41[0x84] = '\0';
    pcVar41[0x85] = '\0';
    pcVar41[0x86] = '\0';
    pcVar41[0x87] = '\0';
    pcVar41[0x88] = '\0';
    pcVar41[0x89] = '\0';
    pcVar41[0x8a] = '\0';
    pcVar41[0x8b] = '\0';
    pcVar41[0x8c] = '\0';
    pcVar41[0x8d] = '\0';
    pcVar41[0x8e] = '\0';
    pcVar41[0x8f] = '\0';
    pcVar41[0x90] = '\0';
    pcVar41[0x91] = '\0';
    pcVar41[0x92] = '\0';
    pcVar41[0x93] = '\0';
    pcVar41[0x94] = '\0';
    pcVar41[0x95] = '\0';
    pcVar41[0x96] = '\0';
    pcVar41[0x97] = '\0';
    pcVar41[0x98] = '\0';
    pcVar41[0x99] = '\0';
    pcVar41[0x9a] = '\0';
    pcVar41[0x9b] = '\0';
    pcVar41[0x9c] = '\0';
    pcVar41[0x9d] = '\0';
    pcVar41[0x9e] = '\0';
    pcVar41[0x9f] = '\0';
    pcVar41[0xa0] = '\0';
    pcVar41[0xa1] = '\0';
    pcVar41[0xa2] = '\0';
    pcVar41[0xa3] = '\0';
    pcVar41[0xa4] = '\0';
    pcVar41[0xa5] = '\0';
    pcVar41[0xa6] = '\0';
    pcVar41[0xa7] = '\0';
    pcVar41[0xa8] = '\0';
    pcVar41[0xa9] = '\0';
    pcVar41[0xaa] = '\0';
    pcVar41[0xab] = '\0';
    pcVar41[0xac] = '\0';
    pcVar41[0xad] = '\0';
    pcVar41[0xae] = '\0';
    pcVar41[0xaf] = '\0';
    pcVar41[0xb0] = '\0';
    pcVar41[0xb1] = '\0';
    pcVar41[0xb2] = '\0';
    pcVar41[0xb3] = '\0';
    pcVar41[0xb4] = '\0';
    pcVar41[0xb5] = '\0';
    pcVar41[0xb6] = '\0';
    pcVar41[0xb7] = '\0';
    pcVar41[0xb8] = '\0';
    pcVar41[0xb9] = '\0';
    pcVar41[0xba] = '\0';
    pcVar41[0xbb] = '\0';
    pcVar41[0xbc] = '\0';
    pcVar41[0xbd] = '\0';
    pcVar41[0xbe] = '\0';
    pcVar41[0xbf] = '\0';
    pcVar41[0xc0] = '\0';
    pcVar41[0xc1] = '\0';
    pcVar41[0xc2] = '\0';
    pcVar41[0xc3] = '\0';
    pcVar41[0xc4] = '\0';
    pcVar41[0xc5] = '\0';
    pcVar41[0xc6] = '\0';
    pcVar41[199] = '\0';
    pcVar41[200] = '\0';
    pcVar41[0xc9] = '\0';
    pcVar41[0xca] = '\0';
    pcVar41[0xcb] = '\0';
    pcVar41[0xcc] = '\0';
    pcVar41[0xcd] = '\0';
    pcVar41[0xce] = '\0';
    pcVar41[0xcf] = '\0';
    pcVar41[0xd0] = '\0';
    pcVar41[0xd1] = '\0';
    pcVar41[0xd2] = '\0';
    pcVar41[0xd3] = '\0';
    pcVar41[0xd4] = '\0';
    pcVar41[0xd5] = '\0';
    pcVar41[0xd6] = '\0';
    pcVar41[0xd7] = '\0';
    pcVar41[0xd8] = '\0';
    pcVar41[0xd9] = '\0';
    pcVar41[0xda] = '\0';
    pcVar41[0xdb] = '\0';
    pcVar41[0xdc] = '\0';
    pcVar41[0xdd] = '\0';
    pcVar41[0xde] = '\0';
    pcVar41[0xdf] = '\0';
    lVar30 = 0;
    do {
      pcVar4 = pcVar41 + lVar30 * 8;
      pcVar4[0] = '\b';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\b';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      lVar30 = lVar30 + 2;
    } while (lVar30 != 4);
    uVar34 = 1;
    goto LAB_00d2655c;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar10 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
    geomID.field_0.v[1]._0_1_ = 1;
    geomID.field_0.v[0] = (longlong)pTVar10;
    MutexSys::lock(&pTVar10->mutex);
    if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
           ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar10->alloc0).bytesUsed = 0;
    (pTVar10->alloc0).bytesWasted = 0;
    (pTVar10->alloc0).end = 0;
    (pTVar10->alloc0).allocBlockSize = 0;
    (pTVar10->alloc0).ptr = (char *)0x0;
    (pTVar10->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
    }
    else {
      (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar10->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    v2.field_0.v[1]._0_1_ = 1;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar10;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar11._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&left);
    }
    else {
      *iVar11._M_current =
           (ThreadLocal2 *)
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (v2.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)v2.field_0.v[0]);
    }
    if (geomID.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar36 = (alloc.talloc0)->cur;
  uVar34 = (ulong)(-(int)sVar36 & 0xf);
  uVar53 = sVar36 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar34;
  (alloc.talloc0)->cur = uVar53;
  if ((alloc.talloc0)->end < uVar53) {
    (alloc.talloc0)->cur = sVar36;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
      (alloc.talloc0)->ptr = pcVar41;
      sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar36;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = v2.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v2.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar41;
        sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar36;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar41 = (char *)0x0;
          goto LAB_00d263f0;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar36;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar34;
    pcVar41 = (alloc.talloc0)->ptr +
              (uVar53 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00d263f0:
  pcVar41[0xe0] = '\0';
  pcVar41[0xe1] = '\0';
  pcVar41[0xe2] = -0x80;
  pcVar41[0xe3] = '\x7f';
  pcVar41[0xe4] = '\0';
  pcVar41[0xe5] = '\0';
  pcVar41[0xe6] = -0x80;
  pcVar41[0xe7] = '\x7f';
  pcVar41[0xe8] = '\0';
  pcVar41[0xe9] = '\0';
  pcVar41[0xea] = -0x80;
  pcVar41[0xeb] = '\x7f';
  pcVar41[0xec] = '\0';
  pcVar41[0xed] = '\0';
  pcVar41[0xee] = -0x80;
  pcVar41[0xef] = '\x7f';
  pcVar41[0xf0] = '\0';
  pcVar41[0xf1] = '\0';
  pcVar41[0xf2] = -0x80;
  pcVar41[0xf3] = -1;
  pcVar41[0xf4] = '\0';
  pcVar41[0xf5] = '\0';
  pcVar41[0xf6] = -0x80;
  pcVar41[0xf7] = -1;
  pcVar41[0xf8] = '\0';
  pcVar41[0xf9] = '\0';
  pcVar41[0xfa] = -0x80;
  pcVar41[0xfb] = -1;
  pcVar41[0xfc] = '\0';
  pcVar41[0xfd] = '\0';
  pcVar41[0xfe] = -0x80;
  pcVar41[0xff] = -1;
  pcVar41[0x60] = '\0';
  pcVar41[0x61] = '\0';
  pcVar41[0x62] = -0x80;
  pcVar41[99] = '\x7f';
  pcVar41[100] = '\0';
  pcVar41[0x65] = '\0';
  pcVar41[0x66] = -0x80;
  pcVar41[0x67] = '\x7f';
  pcVar41[0x68] = '\0';
  pcVar41[0x69] = '\0';
  pcVar41[0x6a] = -0x80;
  pcVar41[0x6b] = '\x7f';
  pcVar41[0x6c] = '\0';
  pcVar41[0x6d] = '\0';
  pcVar41[0x6e] = -0x80;
  pcVar41[0x6f] = '\x7f';
  pcVar41[0x40] = '\0';
  pcVar41[0x41] = '\0';
  pcVar41[0x42] = -0x80;
  pcVar41[0x43] = '\x7f';
  pcVar41[0x44] = '\0';
  pcVar41[0x45] = '\0';
  pcVar41[0x46] = -0x80;
  pcVar41[0x47] = '\x7f';
  pcVar41[0x48] = '\0';
  pcVar41[0x49] = '\0';
  pcVar41[0x4a] = -0x80;
  pcVar41[0x4b] = '\x7f';
  pcVar41[0x4c] = '\0';
  pcVar41[0x4d] = '\0';
  pcVar41[0x4e] = -0x80;
  pcVar41[0x4f] = '\x7f';
  pcVar41[0x20] = '\0';
  pcVar41[0x21] = '\0';
  pcVar41[0x22] = -0x80;
  pcVar41[0x23] = '\x7f';
  pcVar41[0x24] = '\0';
  pcVar41[0x25] = '\0';
  pcVar41[0x26] = -0x80;
  pcVar41[0x27] = '\x7f';
  pcVar41[0x28] = '\0';
  pcVar41[0x29] = '\0';
  pcVar41[0x2a] = -0x80;
  pcVar41[0x2b] = '\x7f';
  pcVar41[0x2c] = '\0';
  pcVar41[0x2d] = '\0';
  pcVar41[0x2e] = -0x80;
  pcVar41[0x2f] = '\x7f';
  pcVar41[0x70] = '\0';
  pcVar41[0x71] = '\0';
  pcVar41[0x72] = -0x80;
  pcVar41[0x73] = -1;
  pcVar41[0x74] = '\0';
  pcVar41[0x75] = '\0';
  pcVar41[0x76] = -0x80;
  pcVar41[0x77] = -1;
  pcVar41[0x78] = '\0';
  pcVar41[0x79] = '\0';
  pcVar41[0x7a] = -0x80;
  pcVar41[0x7b] = -1;
  pcVar41[0x7c] = '\0';
  pcVar41[0x7d] = '\0';
  pcVar41[0x7e] = -0x80;
  pcVar41[0x7f] = -1;
  pcVar41[0x50] = '\0';
  pcVar41[0x51] = '\0';
  pcVar41[0x52] = -0x80;
  pcVar41[0x53] = -1;
  pcVar41[0x54] = '\0';
  pcVar41[0x55] = '\0';
  pcVar41[0x56] = -0x80;
  pcVar41[0x57] = -1;
  pcVar41[0x58] = '\0';
  pcVar41[0x59] = '\0';
  pcVar41[0x5a] = -0x80;
  pcVar41[0x5b] = -1;
  pcVar41[0x5c] = '\0';
  pcVar41[0x5d] = '\0';
  pcVar41[0x5e] = -0x80;
  pcVar41[0x5f] = -1;
  pcVar41[0x30] = '\0';
  pcVar41[0x31] = '\0';
  pcVar41[0x32] = -0x80;
  pcVar41[0x33] = -1;
  pcVar41[0x34] = '\0';
  pcVar41[0x35] = '\0';
  pcVar41[0x36] = -0x80;
  pcVar41[0x37] = -1;
  pcVar41[0x38] = '\0';
  pcVar41[0x39] = '\0';
  pcVar41[0x3a] = -0x80;
  pcVar41[0x3b] = -1;
  pcVar41[0x3c] = '\0';
  pcVar41[0x3d] = '\0';
  pcVar41[0x3e] = -0x80;
  pcVar41[0x3f] = -1;
  pcVar41[0x80] = '\0';
  pcVar41[0x81] = '\0';
  pcVar41[0x82] = '\0';
  pcVar41[0x83] = '\0';
  pcVar41[0x84] = '\0';
  pcVar41[0x85] = '\0';
  pcVar41[0x86] = '\0';
  pcVar41[0x87] = '\0';
  pcVar41[0x88] = '\0';
  pcVar41[0x89] = '\0';
  pcVar41[0x8a] = '\0';
  pcVar41[0x8b] = '\0';
  pcVar41[0x8c] = '\0';
  pcVar41[0x8d] = '\0';
  pcVar41[0x8e] = '\0';
  pcVar41[0x8f] = '\0';
  pcVar41[0x90] = '\0';
  pcVar41[0x91] = '\0';
  pcVar41[0x92] = '\0';
  pcVar41[0x93] = '\0';
  pcVar41[0x94] = '\0';
  pcVar41[0x95] = '\0';
  pcVar41[0x96] = '\0';
  pcVar41[0x97] = '\0';
  pcVar41[0x98] = '\0';
  pcVar41[0x99] = '\0';
  pcVar41[0x9a] = '\0';
  pcVar41[0x9b] = '\0';
  pcVar41[0x9c] = '\0';
  pcVar41[0x9d] = '\0';
  pcVar41[0x9e] = '\0';
  pcVar41[0x9f] = '\0';
  pcVar41[0xa0] = '\0';
  pcVar41[0xa1] = '\0';
  pcVar41[0xa2] = '\0';
  pcVar41[0xa3] = '\0';
  pcVar41[0xa4] = '\0';
  pcVar41[0xa5] = '\0';
  pcVar41[0xa6] = '\0';
  pcVar41[0xa7] = '\0';
  pcVar41[0xa8] = '\0';
  pcVar41[0xa9] = '\0';
  pcVar41[0xaa] = '\0';
  pcVar41[0xab] = '\0';
  pcVar41[0xac] = '\0';
  pcVar41[0xad] = '\0';
  pcVar41[0xae] = '\0';
  pcVar41[0xaf] = '\0';
  pcVar41[0xb0] = '\0';
  pcVar41[0xb1] = '\0';
  pcVar41[0xb2] = '\0';
  pcVar41[0xb3] = '\0';
  pcVar41[0xb4] = '\0';
  pcVar41[0xb5] = '\0';
  pcVar41[0xb6] = '\0';
  pcVar41[0xb7] = '\0';
  pcVar41[0xb8] = '\0';
  pcVar41[0xb9] = '\0';
  pcVar41[0xba] = '\0';
  pcVar41[0xbb] = '\0';
  pcVar41[0xbc] = '\0';
  pcVar41[0xbd] = '\0';
  pcVar41[0xbe] = '\0';
  pcVar41[0xbf] = '\0';
  pcVar41[0xc0] = '\0';
  pcVar41[0xc1] = '\0';
  pcVar41[0xc2] = '\0';
  pcVar41[0xc3] = '\0';
  pcVar41[0xc4] = '\0';
  pcVar41[0xc5] = '\0';
  pcVar41[0xc6] = '\0';
  pcVar41[199] = '\0';
  pcVar41[200] = '\0';
  pcVar41[0xc9] = '\0';
  pcVar41[0xca] = '\0';
  pcVar41[0xcb] = '\0';
  pcVar41[0xcc] = '\0';
  pcVar41[0xcd] = '\0';
  pcVar41[0xce] = '\0';
  pcVar41[0xcf] = '\0';
  pcVar41[0xd0] = '\0';
  pcVar41[0xd1] = '\0';
  pcVar41[0xd2] = '\0';
  pcVar41[0xd3] = '\0';
  pcVar41[0xd4] = '\0';
  pcVar41[0xd5] = '\0';
  pcVar41[0xd6] = '\0';
  pcVar41[0xd7] = '\0';
  pcVar41[0xd8] = '\0';
  pcVar41[0xd9] = '\0';
  pcVar41[0xda] = '\0';
  pcVar41[0xdb] = '\0';
  pcVar41[0xdc] = '\0';
  pcVar41[0xdd] = '\0';
  pcVar41[0xde] = '\0';
  pcVar41[0xdf] = '\0';
  lVar30 = 0;
  do {
    pcVar4 = pcVar41 + lVar30 * 8;
    pcVar4[0] = '\b';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pcVar4[8] = '\b';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    lVar30 = lVar30 + 2;
  } while (lVar30 != 4);
  uVar34 = 6;
LAB_00d2655c:
  local_1e78._8_8_ = 0xff800000ff800000;
  local_1e78._0_8_ = 0xff800000ff800000;
  local_1e68._8_8_ = 0x7f8000007f800000;
  local_1e68._0_8_ = 0x7f8000007f800000;
  in_00 = (BuildRecord *)&v0;
  if (local_848 != 0) {
    pBVar51 = &values[0].dt;
    uVar53 = 0;
    local_1e68._8_8_ = 0x7f8000007f800000;
    local_1e68._0_8_ = 0x7f8000007f800000;
    local_1e38._8_8_ = 0x7f8000007f800000;
    local_1e38._0_8_ = 0x7f8000007f800000;
    local_1e78._8_8_ = 0xff800000ff800000;
    local_1e78._0_8_ = 0xff800000ff800000;
    local_1df8._8_8_ = 0xff800000ff800000;
    local_1df8._0_8_ = 0xff800000ff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&v2,this,in_00,alloc);
      aVar20 = local_1c58;
      pBVar51[-10].lower = (float)v2.field_0.v[0]._0_4_;
      pBVar51[-10].upper = (float)v2.field_0._4_4_;
      auVar58._8_8_ = local_1c88._8_8_;
      auVar58._0_8_ = local_1c88._0_8_;
      *(undefined1 (*) [16])(pBVar51 + -8) = auVar58;
      pBVar51[-6].lower = (float)local_1c78._0_4_;
      pBVar51[-6].upper = local_1c78.m128[1];
      pBVar51[-5].lower = (float)local_1c78._8_4_;
      pBVar51[-5].upper = local_1c78.m128[3];
      pBVar51[-4].lower = (float)local_1c68._0_4_;
      pBVar51[-4].upper = local_1c68.m128[1];
      pBVar51[-3].lower = (float)local_1c68._8_4_;
      pBVar51[-3].upper = local_1c68.m128[3];
      pBVar51[-2].lower = (float)local_1c58._0_4_;
      pBVar51[-2].upper = local_1c58.m128[1];
      pBVar51[-1].lower = (float)local_1c58._8_4_;
      pBVar51[-1].upper = local_1c58.m128[3];
      *pBVar51 = local_1c48;
      local_1e78 = maxps(local_1e78,*(undefined1 (*) [16])(pBVar51 + -6));
      local_1e38 = minps(local_1e38,*(undefined1 (*) [16])(pBVar51 + -4));
      local_1e68 = minps(local_1e68,auVar58);
      local_1df8 = maxps(local_1df8,*(undefined1 (*) [16])(pBVar51 + -2));
      uVar53 = uVar53 + 1;
      pBVar51 = pBVar51 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
      local_1c58 = aVar20;
    } while (uVar53 < local_848);
  }
  auVar60 = _DAT_01ff1820;
  auVar58 = _DAT_01ff1810;
  if (((uint)uVar34 | (uint)pcVar41 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar42 = (ulong)pcVar41 & 0xfffffffffffffff0;
      pfVar35 = &values[0].dt.upper;
      uVar53 = 0;
      do {
        *(undefined8 *)(uVar42 + uVar53 * 8) = *(undefined8 *)(pfVar35 + -0x15);
        fVar87 = ((BBox1f *)(pfVar35 + -1))->lower;
        fVar86 = 1.0 / (*pfVar35 - fVar87);
        fVar91 = -fVar87 * fVar86;
        fVar82 = 1.0 - fVar91;
        auVar81._0_4_ = pfVar35[-0x11] * fVar82 + pfVar35[-9] * fVar91;
        auVar81._4_4_ = pfVar35[-0x10] * fVar82 + pfVar35[-8] * fVar91;
        auVar81._8_4_ = pfVar35[-0xf] * fVar82 + pfVar35[-7] * fVar91;
        auVar81._12_4_ = pfVar35[-0xe] * fVar82 + pfVar35[-6] * fVar91;
        auVar83._0_4_ = fVar82 * pfVar35[-0xd] + fVar91 * pfVar35[-5];
        auVar83._4_4_ = fVar82 * pfVar35[-0xc] + fVar91 * pfVar35[-4];
        auVar83._8_4_ = fVar82 * pfVar35[-0xb] + fVar91 * pfVar35[-3];
        auVar83._12_4_ = fVar82 * pfVar35[-10] + fVar91 * pfVar35[-2];
        fVar86 = (1.0 - fVar87) * fVar86;
        fVar87 = 1.0 - fVar86;
        auVar79._0_4_ = pfVar35[-0x11] * fVar87 + pfVar35[-9] * fVar86;
        auVar79._4_4_ = pfVar35[-0x10] * fVar87 + pfVar35[-8] * fVar86;
        auVar79._8_4_ = pfVar35[-0xf] * fVar87 + pfVar35[-7] * fVar86;
        auVar79._12_4_ = pfVar35[-0xe] * fVar87 + pfVar35[-6] * fVar86;
        auVar88._0_4_ = fVar87 * pfVar35[-0xd] + fVar86 * pfVar35[-5];
        auVar88._4_4_ = fVar87 * pfVar35[-0xc] + fVar86 * pfVar35[-4];
        auVar88._8_4_ = fVar87 * pfVar35[-0xb] + fVar86 * pfVar35[-3];
        auVar88._12_4_ = fVar87 * pfVar35[-10] + fVar86 * pfVar35[-2];
        auVar81 = minps(auVar81,auVar60);
        auVar83 = maxps(auVar83,auVar58);
        auVar79 = minps(auVar79,auVar60);
        auVar88 = maxps(auVar88,auVar58);
        fVar87 = auVar81._0_4_ - ABS(auVar81._0_4_) * 4.7683716e-07;
        fVar82 = auVar81._4_4_ - ABS(auVar81._4_4_) * 4.7683716e-07;
        fVar86 = auVar81._8_4_ - ABS(auVar81._8_4_) * 4.7683716e-07;
        fVar91 = ABS(auVar83._0_4_) * 4.7683716e-07 + auVar83._0_4_;
        fVar89 = ABS(auVar83._4_4_) * 4.7683716e-07 + auVar83._4_4_;
        fVar90 = ABS(auVar83._8_4_) * 4.7683716e-07 + auVar83._8_4_;
        *(float *)(uVar42 + 0x20 + uVar53 * 4) = fVar87;
        *(float *)(uVar42 + 0x40 + uVar53 * 4) = fVar82;
        *(float *)(uVar42 + 0x60 + uVar53 * 4) = fVar86;
        *(float *)(uVar42 + 0x30 + uVar53 * 4) = fVar91;
        *(float *)(uVar42 + 0x50 + uVar53 * 4) = fVar89;
        *(float *)(uVar42 + 0x70 + uVar53 * 4) = fVar90;
        *(float *)(uVar42 + 0x80 + uVar53 * 4) =
             (auVar79._0_4_ - ABS(auVar79._0_4_) * 4.7683716e-07) - fVar87;
        *(float *)(uVar42 + 0xa0 + uVar53 * 4) =
             (auVar79._4_4_ - ABS(auVar79._4_4_) * 4.7683716e-07) - fVar82;
        *(float *)(uVar42 + 0xc0 + uVar53 * 4) =
             (auVar79._8_4_ - ABS(auVar79._8_4_) * 4.7683716e-07) - fVar86;
        *(float *)(uVar42 + 0x90 + uVar53 * 4) =
             (ABS(auVar88._0_4_) * 4.7683716e-07 + auVar88._0_4_) - fVar91;
        *(float *)(uVar42 + 0xb0 + uVar53 * 4) =
             (ABS(auVar88._4_4_) * 4.7683716e-07 + auVar88._4_4_) - fVar89;
        *(float *)(uVar42 + 0xd0 + uVar53 * 4) =
             (ABS(auVar88._8_4_) * 4.7683716e-07 + auVar88._8_4_) - fVar90;
        uVar53 = uVar53 + 1;
        pfVar35 = pfVar35 + 0x18;
      } while (local_848 != uVar53);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeaf<4,embree::TriangleMesh,embree::TriangleMi<4>>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  uVar42 = uStack_1850;
  uVar53 = local_1858;
  if (bVar25) {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)local_18b8;
    geomID.field_0.v[0] = 0x7f8000007f800000;
    geomID.field_0.v[1] = 0x7f8000007f800000;
    local_1b38._0_8_ = 0xff800000ff800000;
    local_1b38._8_8_ = 0xff800000ff800000;
    local_1b28 = 0x7f8000007f800000;
    BStack_1b20.lower = INFINITY;
    BStack_1b20.upper = INFINITY;
    local_1b18.lower = -INFINITY;
    local_1b18.upper = -INFINITY;
    uStack_1b10 = 0xff800000ff800000;
    if (uStack_1850 - local_1858 < 0xc00) {
      v2.field_0.v[0] = local_1858;
      v2.field_0.v[1] = uStack_1850;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&left,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&v2);
    }
    else {
      v2.field_0.v[1]._4_2_ = 0x401;
      local_1c78.m128[0] = 0.0;
      local_1c78.m128[1] = 0.0;
      local_1c78.m128[2] = 0.0;
      local_1c78.m128[3] = 0.0;
      local_1c58._0_8_ = 8;
      tbb::detail::r1::initialize((task_group_context *)&v2);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar42;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar53;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,(blocked_range<unsigned_long> *)&geomID
                 ,(LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v2,
                 in_stack_ffffffffffffe168);
      cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v2);
      if (cVar28 != '\0') {
        prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar38,"task cancelled");
        __cxa_throw(prVar38,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&v2);
    }
    (__return_storage_ptr__->ref).ptr = uVar34 | (ulong)pcVar41;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    local_1df8._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_;
    local_1df8._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_;
  }
  else {
    (__return_storage_ptr__->ref).ptr = uVar34 | (ulong)pcVar41;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1e68._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1e68._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e78._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e78._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e38._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1df8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1df8._8_8_;
  __return_storage_ptr__->dt = BStack_1830;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar34 = 0;
  do {
    pBVar12 = local_8c8[uVar34];
    pBVar51 = pBVar12 + 1;
    *pBVar51 = (BBox1f)((long)*pBVar51 + -1);
    if ((*pBVar51 == (BBox1f)0x0) && (BVar5 = *pBVar12, BVar5 != (BBox1f)0x0)) {
      lVar30 = *(undefined8 *)((long)BVar5 + 0x18);
      pvVar33 = *(void **)((long)BVar5 + 0x20);
      if (pvVar33 != (void *)0x0) {
        if ((ulong)(lVar30 * 0x50) < 0x1c00000) {
          alignedFree(pvVar33);
        }
        else {
          os_free(pvVar33,lVar30 * 0x50,*(bool *)((long)BVar5 + 8));
        }
      }
      if (lVar30 != 0) {
        (**(code **)**(undefined8 **)BVar5)(*(undefined8 **)BVar5,lVar30 * -0x50,1);
      }
      *(undefined8 *)((long)BVar5 + 0x10) = 0;
      *(undefined8 *)((long)BVar5 + 0x18) = 0;
      *(undefined8 *)((long)BVar5 + 0x20) = 0;
      operator_delete((void *)BVar5);
    }
    uVar34 = uVar34 + 1;
  } while (uVar34 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }